

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracker.cpp
# Opt level: O3

void __thiscall SpeciesTracker::Register(SpeciesTracker *this,Ptr *reaction)

{
  pointer pbVar1;
  element_type *peVar2;
  pointer pbVar3;
  Ptr local_50;
  Ptr local_40;
  
  peVar2 = (reaction->super___shared_ptr<SpeciesReaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  pbVar3 = (peVar2->reactants_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (peVar2->reactants_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar3 != pbVar1) {
    do {
      local_40.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           &((reaction->super___shared_ptr<SpeciesReaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
            super_Reaction;
      local_40.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (reaction->super___shared_ptr<SpeciesReaction,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
      if (local_40.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_40.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_use_count = (local_40.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_40.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_use_count = (local_40.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      Add(this,pbVar3,&local_40);
      if (local_40.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_40.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      Increment(this,pbVar3,0);
      pbVar3 = pbVar3 + 1;
    } while (pbVar3 != pbVar1);
    peVar2 = (reaction->super___shared_ptr<SpeciesReaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  }
  pbVar3 = (peVar2->products_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (peVar2->products_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar3 != pbVar1) {
    do {
      local_50.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           &((reaction->super___shared_ptr<SpeciesReaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
            super_Reaction;
      local_50.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (reaction->super___shared_ptr<SpeciesReaction,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
      if (local_50.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_50.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_use_count = (local_50.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_50.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_use_count = (local_50.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      Add(this,pbVar3,&local_50);
      if (local_50.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_50.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      Increment(this,pbVar3,0);
      pbVar3 = pbVar3 + 1;
    } while (pbVar3 != pbVar1);
  }
  return;
}

Assistant:

void SpeciesTracker::Register(SpeciesReaction::Ptr reaction) {
  // Add this reaction to SpeciesTracker
  for (const auto &reactant : reaction->reactants()) {
    Add(reactant, reaction);
    // Initialize reactant counts (this usually gets set to some non-zero
    // value later)
    Increment(reactant, 0);
  }
  // Do the same for products
  for (const auto &product : reaction->products()) {
    Add(product, reaction);
    Increment(product, 0);
  }
}